

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logfile.cpp
# Opt level: O0

void __thiscall LogFile::RollFile(LogFile *this)

{
  time_t nowTime_00;
  WriteFile *this_00;
  string local_68 [48];
  string local_38 [8];
  string sLogName;
  time_t nowTime;
  LogFile *this_local;
  
  nowTime_00 = time((time_t *)0x0);
  std::__cxx11::string::string(local_38);
  GetFileName(this,nowTime_00,(string *)local_38);
  this_00 = (WriteFile *)operator_new(0x10010);
  std::__cxx11::string::string(local_68,local_38);
  WriteFile::WriteFile(this_00,(string *)local_68);
  std::unique_ptr<WriteFile,_std::default_delete<WriteFile>_>::reset(&this->m_ptWriteFile,this_00);
  std::__cxx11::string::~string(local_68);
  this->m_cnt = 0;
  this->m_writedSize = 0;
  this->m_lastFlushTime = nowTime_00;
  this->m_lastRollTime = nowTime_00;
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void LogFile::RollFile()
{
	time_t nowTime = time(NULL);
	std::string sLogName;
	GetFileName(nowTime, sLogName);
	m_ptWriteFile.reset(new WriteFile(sLogName));
	m_cnt = 0;
	m_writedSize = 0;
	m_lastFlushTime = nowTime;
	m_lastRollTime = nowTime;
}